

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O0

RC __thiscall PF_HashTable::Find(PF_HashTable *this,int fd,PageNum pageNum,int *slot)

{
  int iVar1;
  PF_HashEntry *local_38;
  PF_HashEntry *entry;
  int bucket;
  int *slot_local;
  PageNum pageNum_local;
  int fd_local;
  PF_HashTable *this_local;
  
  iVar1 = Hash(this,fd,pageNum);
  if (-1 < iVar1) {
    for (local_38 = this->hashTable[iVar1]; local_38 != (PF_HashEntry *)0x0;
        local_38 = local_38->next) {
      if ((local_38->fd == fd) && (local_38->pageNum == pageNum)) {
        *slot = local_38->slot;
        return 0;
      }
    }
  }
  return -8;
}

Assistant:

RC PF_HashTable::Find(int fd, PageNum pageNum, int &slot)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  if (bucket<0)
     return (PF_HASHNOTFOUND);

  // Go through the linked list of this bucket
  for (PF_HashEntry *entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum) {

      // Found it
      slot = entry->slot;
      return (0);
    }
  }

  // Didn't find it
  return (PF_HASHNOTFOUND);
}